

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

vector<slang::BufferID,_std::allocator<slang::BufferID>_> * __thiscall
slang::SourceManager::getAllBuffers
          (vector<slang::BufferID,_std::allocator<slang::BufferID>_> *__return_storage_ptr__,
          SourceManager *this)

{
  size_t i;
  ulong uVar1;
  BufferID local_3c;
  shared_lock<std::shared_mutex> lock;
  
  lock._M_owns = true;
  lock._M_pm = &this->mut;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar1 = 1;
      uVar1 < (ulong)(((long)(this->bufferEntries).
                             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->bufferEntries).
                            super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar1 = uVar1 + 1) {
    local_3c.id = (uint32_t)uVar1;
    std::vector<slang::BufferID,_std::allocator<slang::BufferID>_>::emplace_back<slang::BufferID>
              (__return_storage_ptr__,&local_3c);
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BufferID> SourceManager::getAllBuffers() const {
    std::shared_lock lock(mut);
    std::vector<BufferID> result;
    for (size_t i = 1; i < bufferEntries.size(); i++)
        result.push_back(BufferID((uint32_t)i, ""sv));

    return result;
}